

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# suffix_array.hpp
# Opt level: O1

void __thiscall
suffix_array<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,unsigned_long,false>::
construct_arr<2ul>(suffix_array<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,unsigned_long,false>
                   *this,bool fast_resolval)

{
  long *plVar1;
  long lVar2;
  pair<unsigned_int,_unsigned_int> pVar3;
  unsigned_long uVar4;
  ostream *poVar5;
  pointer paVar6;
  unsigned_long *puVar7;
  long lVar8;
  long lVar9;
  undefined7 in_register_00000031;
  ulong uVar10;
  _Alloc_hider _Var11;
  MPI_Comm *ppoVar12;
  uint uVar13;
  ulong k;
  bool bVar14;
  pair<unsigned_long,_unsigned_long> pVar15;
  vector<std::array<unsigned_long,_3UL>,_std::allocator<std::array<unsigned_long,_3UL>_>_> tuples;
  section_timer looptimer;
  vector<unsigned_long,_std::allocator<unsigned_long>_> cpy_SA;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_B_SA;
  section_timer timer;
  string local_148;
  suffix_array<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,unsigned_long,false>
  *local_128;
  vector<std::array<unsigned_long,_3UL>,_std::allocator<std::array<unsigned_long,_3UL>_>_> local_120
  ;
  suffix_array<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,unsigned_long,false>
  *local_108;
  undefined4 local_fc;
  section_timer_impl<std::chrono::duration<double,_std::ratio<1L,_1000L>_>_> local_f8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_b0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_98;
  section_timer_impl<std::chrono::duration<double,_std::ratio<1L,_1000L>_>_> local_78;
  
  local_fc = (undefined4)CONCAT71(in_register_00000031,fast_resolval);
  mxx::section_timer_impl<std::chrono::duration<double,_std::ratio<1L,_1000L>_>_>::
  section_timer_impl(&local_78,(ostream *)&std::cerr,*(MPI_Comm *)(this + 0x20),0);
  pVar3 = suffix_array<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_unsigned_long,_false>
          ::initial_bucketing((suffix_array<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_unsigned_long,_false>
                               *)this,0);
  local_f8._vptr_section_timer_impl = (_func_int **)&local_f8.comm;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"initial-bucketing","");
  mxx::section_timer_impl<std::chrono::duration<double,_std::ratio<1L,_1000L>_>_>::end_section
            (&local_78,(string *)&local_f8);
  if ((MPI_Comm *)local_f8._vptr_section_timer_impl != &local_f8.comm) {
    operator_delete(local_f8._vptr_section_timer_impl);
  }
  local_128 = this + 0x90;
  if (*(long *)(this + 0x98) - *(long *)(this + 0x90) !=
      *(long *)(this + 0xb0) - *(long *)(this + 0xa8)) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_128,
               *(long *)(this + 0xb0) - *(long *)(this + 0xa8) >> 3);
  }
  local_108 = this + 0xa8;
  local_98.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  k = (ulong)pVar3 & 0xffffffff;
  uVar13 = pVar3.first;
  if (k < *(ulong *)(this + 8)) {
    do {
      mxx::section_timer_impl<std::chrono::duration<double,_std::ratio<1L,_1000L>_>_>::
      section_timer_impl(&local_f8,(ostream *)&std::cerr,*(MPI_Comm *)(this + 0x20),0);
      std::vector<std::array<unsigned_long,_3UL>,_std::allocator<std::array<unsigned_long,_3UL>_>_>
      ::vector(&local_120,*(size_type *)(this + 0x10),(allocator_type *)&local_148);
      if (*(long *)(this + 0x10) != 0) {
        lVar2 = *(long *)(this + 0x80);
        lVar8 = *(long *)local_108;
        puVar7 = (local_120.
                  super__Vector_base<std::array<unsigned_long,_3UL>,_std::allocator<std::array<unsigned_long,_3UL>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->_M_elems + 1;
        uVar10 = 0;
        do {
          ((array<unsigned_long,_3UL> *)(puVar7 + -1))->_M_elems[0] = lVar2 + uVar10;
          *puVar7 = *(unsigned_long *)(lVar8 + uVar10 * 8);
          uVar10 = uVar10 + 1;
          puVar7 = puVar7 + 3;
        } while (uVar10 < *(ulong *)(this + 0x10));
      }
      local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"arr-tupelize","");
      mxx::section_timer_impl<std::chrono::duration<double,_std::ratio<1L,_1000L>_>_>::end_section
                (&local_f8,&local_148);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_148._M_dataplus._M_p != &local_148.field_2) {
        operator_delete(local_148._M_dataplus._M_p);
      }
      suffix_array<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_unsigned_long,_false>
      ::shift_buckets<2UL>
                ((suffix_array<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_unsigned_long,_false>
                  *)this,k,&local_120);
      local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"shift-buckets","");
      mxx::section_timer_impl<std::chrono::duration<double,_std::ratio<1L,_1000L>_>_>::end_section
                (&local_f8,&local_148);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_148._M_dataplus._M_p != &local_148.field_2) {
        operator_delete(local_148._M_dataplus._M_p);
      }
      suffix_array<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_unsigned_long,_false>
      ::sort_array_tuples<2UL>
                ((suffix_array<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_unsigned_long,_false>
                  *)this,&local_120);
      local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"ISA-to-SA","");
      mxx::section_timer_impl<std::chrono::duration<double,_std::ratio<1L,_1000L>_>_>::end_section
                (&local_f8,&local_148);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_148._M_dataplus._M_p != &local_148.field_2) {
        operator_delete(local_148._M_dataplus._M_p);
      }
      pVar15 = suffix_array<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_unsigned_long,_false>
               ::rebucket_arr<2UL>((suffix_array<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_unsigned_long,_false>
                                    *)this,&local_120,true);
      uVar4 = pVar15.first;
      if (*(int *)(this + 0x2c) == 0) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"iteration ",10);
        poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,": unfinished buckets = ",0x17);
        poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,", unfinished elements = ",0x18);
        poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
        std::ostream::put((char)poVar5);
        std::ostream::flush();
      }
      local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"rebucket","");
      mxx::section_timer_impl<std::chrono::duration<double,_std::ratio<1L,_1000L>_>_>::end_section
                (&local_f8,&local_148);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_148._M_dataplus._M_p != &local_148.field_2) {
        operator_delete(local_148._M_dataplus._M_p);
      }
      if (*(long *)(this + 0x10) != 0) {
        lVar2 = *(long *)local_128;
        uVar10 = 0;
        paVar6 = local_120.
                 super__Vector_base<std::array<unsigned_long,_3UL>,_std::allocator<std::array<unsigned_long,_3UL>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        do {
          *(unsigned_long *)(lVar2 + uVar10 * 8) = paVar6->_M_elems[0];
          uVar10 = uVar10 + 1;
          paVar6 = paVar6 + 1;
        } while (uVar10 < *(ulong *)(this + 0x10));
      }
      if (local_120.
          super__Vector_base<std::array<unsigned_long,_3UL>,_std::allocator<std::array<unsigned_long,_3UL>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          local_120.
          super__Vector_base<std::array<unsigned_long,_3UL>,_std::allocator<std::array<unsigned_long,_3UL>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        local_120.
        super__Vector_base<std::array<unsigned_long,_3UL>,_std::allocator<std::array<unsigned_long,_3UL>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             local_120.
             super__Vector_base<std::array<unsigned_long,_3UL>,_std::allocator<std::array<unsigned_long,_3UL>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
      }
      if (local_120.
          super__Vector_base<std::array<unsigned_long,_3UL>,_std::allocator<std::array<unsigned_long,_3UL>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage !=
          local_120.
          super__Vector_base<std::array<unsigned_long,_3UL>,_std::allocator<std::array<unsigned_long,_3UL>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        std::
        __shrink_to_fit_aux<std::vector<std::array<unsigned_long,_3UL>,_std::allocator<std::array<unsigned_long,_3UL>_>_>,_true>
        ::_S_do_it(&local_120);
      }
      local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"arr-untupelize","");
      mxx::section_timer_impl<std::chrono::duration<double,_std::ratio<1L,_1000L>_>_>::end_section
                (&local_f8,&local_148);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_148._M_dataplus._M_p != &local_148.field_2) {
        operator_delete(local_148._M_dataplus._M_p);
      }
      if (((char)local_fc == '\0') || (*(ulong *)(this + 8) / 10 <= pVar15.second)) {
        if (uVar4 == 0 || *(ulong *)(this + 8) <= k * 2) {
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                    (&local_b0,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_128);
          suffix_array<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_unsigned_long,_false>
          ::reorder_sa_to_isa((suffix_array<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_unsigned_long,_false>
                               *)this,&local_b0);
          local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"SA-to-ISA","");
          mxx::section_timer_impl<std::chrono::duration<double,_std::ratio<1L,_1000L>_>_>::
          end_section(&local_f8,&local_148);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_148._M_dataplus._M_p != &local_148.field_2) {
            operator_delete(local_148._M_dataplus._M_p);
          }
          _Var11._M_p = (pointer)local_b0.
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_start;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
LAB_00120575:
            operator_delete(_Var11._M_p);
          }
        }
        else {
          suffix_array<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_unsigned_long,_false>
          ::reorder_sa_to_isa((suffix_array<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_unsigned_long,_false>
                               *)this,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                      local_128);
          local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"SA-to-ISA","");
          mxx::section_timer_impl<std::chrono::duration<double,_std::ratio<1L,_1000L>_>_>::
          end_section(&local_f8,&local_148);
          _Var11._M_p = local_148._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_148._M_dataplus._M_p != &local_148.field_2) goto LAB_00120575;
        }
        local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"sac-iteration","");
        mxx::section_timer_impl<std::chrono::duration<double,_std::ratio<1L,_1000L>_>_>::end_section
                  (&local_78,&local_148);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_148._M_dataplus._M_p != &local_148.field_2) {
          operator_delete(local_148._M_dataplus._M_p);
        }
        bVar14 = uVar4 != 0;
      }
      else {
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                  (&local_b0,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_128);
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                  (&local_98,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_108);
        suffix_array<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_unsigned_long,_false>
        ::reorder_sa_to_isa((suffix_array<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_unsigned_long,_false>
                             *)this,&local_b0);
        local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"SA-to-ISA","");
        mxx::section_timer_impl<std::chrono::duration<double,_std::ratio<1L,_1000L>_>_>::end_section
                  (&local_f8,&local_148);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_148._M_dataplus._M_p != &local_148.field_2) {
          operator_delete(local_148._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          operator_delete(local_b0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start);
        }
        bVar14 = false;
      }
      if (local_120.
          super__Vector_base<std::array<unsigned_long,_3UL>,_std::allocator<std::array<unsigned_long,_3UL>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_120.
                        super__Vector_base<std::array<unsigned_long,_3UL>,_std::allocator<std::array<unsigned_long,_3UL>_>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
      mxx::section_timer_impl<std::chrono::duration<double,std::ratio<1l,1000l>>>::depth =
           mxx::section_timer_impl<std::chrono::duration<double,std::ratio<1l,1000l>>>::depth + -1;
      local_f8._vptr_section_timer_impl = (_func_int **)&PTR__section_timer_impl_001509a8;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8.sep._M_dataplus._M_p != &local_f8.sep.field_2) {
        operator_delete(local_f8.sep._M_dataplus._M_p);
      }
    } while ((bVar14) && (k = k * 2, k < *(ulong *)(this + 8)));
    uVar13 = (uint)k;
    bVar14 = uVar4 == 0;
  }
  else {
    bVar14 = false;
  }
  ppoVar12 = &local_f8.comm;
  if (!bVar14) {
    if (*(int *)(this + 0x2c) == 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Starting Bucket chasing algorithm",0x21);
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'P');
      std::ostream::put('P');
      std::ostream::flush();
    }
    suffix_array<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_unsigned_long,_false>
    ::construct_msgs((suffix_array<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_unsigned_long,_false>
                      *)this,&local_98,
                     (vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_108,uVar13 * 2);
  }
  local_f8._vptr_section_timer_impl = (_func_int **)ppoVar12;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"construct-msgs","");
  mxx::section_timer_impl<std::chrono::duration<double,_std::ratio<1L,_1000L>_>_>::end_section
            (&local_78,(string *)&local_f8);
  if ((MPI_Comm *)local_f8._vptr_section_timer_impl != ppoVar12) {
    operator_delete(local_f8._vptr_section_timer_impl);
  }
  lVar2 = *(long *)(this + 0xa8);
  lVar8 = *(long *)(this + 0xb0) - lVar2;
  if (lVar8 != 0) {
    lVar8 = lVar8 >> 3;
    lVar9 = 0;
    do {
      plVar1 = (long *)(lVar2 + lVar9 * 8);
      *plVar1 = *plVar1 + -1;
      lVar9 = lVar9 + 1;
    } while (lVar8 + (ulong)(lVar8 == 0) != lVar9);
  }
  local_f8._vptr_section_timer_impl = (_func_int **)ppoVar12;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"fix-isa","");
  mxx::section_timer_impl<std::chrono::duration<double,_std::ratio<1L,_1000L>_>_>::end_section
            (&local_78,(string *)&local_f8);
  if ((MPI_Comm *)local_f8._vptr_section_timer_impl != ppoVar12) {
    operator_delete(local_f8._vptr_section_timer_impl);
  }
  if (local_98.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_98.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  mxx::section_timer_impl<std::chrono::duration<double,std::ratio<1l,1000l>>>::depth =
       mxx::section_timer_impl<std::chrono::duration<double,std::ratio<1l,1000l>>>::depth + -1;
  local_78._vptr_section_timer_impl = (_func_int **)&PTR__section_timer_impl_001509a8;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.sep._M_dataplus._M_p != &local_78.sep.field_2) {
    operator_delete(local_78.sep._M_dataplus._M_p);
  }
  return;
}

Assistant:

void construct_arr(bool fast_resolval = true) {
    SAC_TIMER_START();

    /***********************
     *  Initial bucketing  *
     ***********************/

    // create initial k-mers and use these as the initial bucket numbers
    // for each character position
    // `k` depends on the alphabet size and the word size of each suffix array
    // element. `k` is choosen to maximize the number of alphabet characters
    // that fit into one machine word
    unsigned int k;
    unsigned int bits_per_char;
    std::tie(k, bits_per_char) = initial_bucketing();
    SAC_TIMER_END_SECTION("initial-bucketing");

    // init local_SA
    if (local_SA.size() != local_B.size()) {
        local_SA.resize(local_B.size());
    }

    std::vector<index_t> local_B_SA;
    std::size_t unfinished_buckets = 1<<k;
    std::size_t unfinished_elements = n;
    std::size_t shift_by;

    /*******************************
     *  Prefix Doubling main loop  *
     *******************************/
    for (shift_by = k; shift_by < n; shift_by*=L) {
        SAC_TIMER_LOOP_START();

        /*****************
         *  fill tuples  *
         *****************/
        std::vector<std::array<index_t, L+1> > tuples(local_size);
        std::size_t offset = part.excl_prefix_size();
        for (std::size_t i = 0; i < local_size; ++i) {
            tuples[i][0] = i + offset;
            tuples[i][1] = local_B[i];
        }
        SAC_TIMER_END_LOOP_SECTION(shift_by, "arr-tupelize");

        /**************************************************
         *  Pairing buckets by shifting `shift_by` = 2^k  *
         **************************************************/
        // shift the B1 buckets by 2^k to the left => equals B2
        shift_buckets<L>(shift_by, tuples);
        SAC_TIMER_END_LOOP_SECTION(shift_by, "shift-buckets");


        /*************
         *  ISA->SA  *
         *************/
        // by using sample sort on tuples (B1,B2)
        sort_array_tuples<L>(tuples);
        SAC_TIMER_END_LOOP_SECTION(shift_by, "ISA-to-SA");


        /****************
         *  Update LCP  *
         ****************/
        // if this is the first iteration: create LCP, otherwise update
        // TODO: LCP construciton is not (yet) implemented for std::array based construction
        /*
        if (_CONSTRUCT_LCP)
        {
            if (shift_by == k) {
                initial_kmer_lcp(k, bits_per_char, local_B2);
                SAC_TIMER_END_LOOP_SECTION(shift_by, "init-lcp");
            } else {
                resolve_next_lcp(shift_by, local_B2);
                SAC_TIMER_END_LOOP_SECTION(shift_by, "update-lcp");
            }
        }
        */

        /*******************************
         *  Assign new bucket numbers  *
         *******************************/
        std::tie(unfinished_buckets,unfinished_elements) = rebucket_arr<L>(tuples, true);
        if (comm.rank() == 0) {
            INFO("iteration " << shift_by << ": unfinished buckets = " << unfinished_buckets << ", unfinished elements = " << unfinished_elements);
        }
        SAC_TIMER_END_LOOP_SECTION(shift_by, "rebucket");


        /**************************************
         *  Reset local_SA array from tuples  *
         **************************************/
        for (std::size_t i = 0; i < local_size; ++i) {
            local_SA[i] = tuples[i][0];
        }

        // deallocate all memory
        tuples.clear();
        tuples.shrink_to_fit();
        SAC_TIMER_END_LOOP_SECTION(shift_by, "arr-untupelize");


        /*************
         *  SA->ISA  *
         *************/
        // by bucketing to correct target processor using the `SA` array

        if (fast_resolval && unfinished_elements < n/10) {
            // prepare for bucket chaising (needs SA, and bucket arrays in both
            // SA and ISA order)
            std::vector<index_t> cpy_SA(local_SA);
            local_B_SA = local_B; // copy
            reorder_sa_to_isa(cpy_SA);
            SAC_TIMER_END_LOOP_SECTION(shift_by, "SA-to-ISA");
            break;
        } else if ((shift_by * L) >= n || unfinished_buckets == 0) {
            // if last iteration, use copy of local_SA for reorder and keep
            // original SA
            std::vector<index_t> cpy_SA(local_SA);
            reorder_sa_to_isa(cpy_SA);
            SAC_TIMER_END_LOOP_SECTION(shift_by, "SA-to-ISA");
        } else {
            reorder_sa_to_isa();
            SAC_TIMER_END_LOOP_SECTION(shift_by, "SA-to-ISA");
        }

        // end iteratior
        SAC_TIMER_END_SECTION("sac-iteration");

        // check for termination condition
        if (unfinished_buckets == 0)
            break;
    }

    if (unfinished_buckets > 0) {
        if (comm.rank() == 0)
            INFO("Starting Bucket chasing algorithm");
        construct_msgs(local_B_SA, local_B, L*shift_by);
    }
    SAC_TIMER_END_SECTION("construct-msgs");

    // now local_SA is actual block decomposed SA and local_B is actual ISA with an offset of one
    for (std::size_t i = 0; i < local_B.size(); ++i) {
        // the buffer indeces are `1` based indeces, but the ISA should be
        // `0` based indeces
        local_B[i] -= 1;
    }
    SAC_TIMER_END_SECTION("fix-isa");
}